

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

int lws_service_fd_tsi(lws_context *context,pollfd *pollfd,int tsi)

{
  byte *pbVar1;
  lws_role_ops *plVar2;
  int iVar3;
  lws_ssl_capable_status lVar4;
  undefined8 in_RAX;
  lws *wsi;
  size_t sVar5;
  lws_log_cx *plVar6;
  long lVar7;
  undefined4 uVar8;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  if (context == (lws_context *)0x0) {
    return -1;
  }
  if ((context->field_0x7b7 & 8) != 0) {
    return -1;
  }
  lVar7 = (long)tsi * 0x1a0;
  if ((*(byte *)((long)context->lcg + lVar7 + -0x4d) & 0x10) != 0) {
    return -1;
  }
  if (pollfd == (pollfd *)0x0) {
    __assert_fail("pollfd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                  ,0x278,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
  }
  if (pollfd->fd == -1) {
    __assert_fail("lws_socket_is_valid(pollfd->fd)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                  ,0x27b,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
  }
  wsi = wsi_from_fd(context,pollfd->fd);
  if (wsi == (lws *)0x0) {
    return 0;
  }
  if (((~pollfd->revents & 0x18U) == 0) &&
     (wsi->field_0x46f = wsi->field_0x46f | 0x10, (pollfd->revents & pollfd->events & 1U) == 0)) {
    sVar5 = lws_buflist_total_len(&wsi->buflist);
    if (sVar5 != 0) {
      lws_set_timeout(wsi,PENDING_TIMEOUT_CLOSE_ACK,3);
      goto LAB_001176be;
    }
    plVar6 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,0x10,"lws_service_fd_tsi","Session Socket %d dead",
                CONCAT44(uVar8,pollfd->fd));
LAB_001177a7:
    plVar6 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,0x10,"lws_service_fd_tsi","Close and handled");
    lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"close_and_handled");
LAB_001177e7:
    iVar3 = 1;
  }
  else {
LAB_001176be:
    if ((((short)wsi->wsistate == 0x1f) && (iVar3 = lws_is_ssl(wsi), iVar3 != 0)) &&
       ((wsi->tls).ssl != (lws_tls_conn *)0x0)) {
      lVar4 = __lws_tls_shutdown(wsi);
      if (2 < (uint)(lVar4 + 4)) {
        if ((uint)(lVar4 + ~LWS_SSL_CAPABLE_MORE_SERVICE_READ) < 2) goto LAB_001177a7;
        goto LAB_001176fa;
      }
    }
    else {
LAB_001176fa:
      wsi->field_0x473 = wsi->field_0x473 & 0xdf;
      pbVar1 = (byte *)((long)context->lcg + lVar7 + -0x4d);
      *pbVar1 = *pbVar1 | 2;
      plVar2 = wsi->role_ops;
      if (plVar2 == (lws_role_ops *)0x0) {
        __assert_fail("wsi->role_ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                      ,0x2cf,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
      }
      iVar3 = (*plVar2->rops_table[(ulong)(plVar2->rops_idx[2] & 0xf) - 1].check_upgrades)
                        ((lws *)(context->pt + tsi));
      if (iVar3 == 4) goto LAB_001177e7;
      if (iVar3 != 5) {
        if (iVar3 != 6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                        ,0x2f5,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)")
          ;
        }
        goto LAB_001177a7;
      }
    }
    pollfd->revents = 0;
    iVar3 = 0;
  }
  pbVar1 = (byte *)((long)context->lcg + lVar7 + -0x4d);
  *pbVar1 = *pbVar1 & 0xfd;
  return iVar3;
}

Assistant:

int
lws_service_fd_tsi(struct lws_context *context, struct lws_pollfd *pollfd,
		   int tsi)
{
	struct lws_context_per_thread *pt;
	struct lws *wsi;

	if (!context || context->service_no_longer_possible)
		return -1;

	pt = &context->pt[tsi];

	if (pt->event_loop_pt_unused)
		return -1;

	if (!pollfd) {
		/*
		 * calling with NULL pollfd for periodic background processing
		 * is no longer needed and is now illegal.
		 */
		assert(pollfd);
		return -1;
	}
	assert(lws_socket_is_valid(pollfd->fd));

	/* no, here to service a socket descriptor */
	wsi = wsi_from_fd(context, pollfd->fd);
	if (!wsi)
		/* not lws connection ... leave revents alone and return */
		return 0;

#if LWS_MAX_SMP > 1
	if (wsi->undergoing_init_from_other_pt)
		/*
		 * Temporary situation that other service thread is initializing
		 * this wsi right now for use on our service thread.
		 */
		return 0;
#endif

	/*
	 * so that caller can tell we handled, past here we need to
	 * zero down pollfd->revents after handling
	 */

	/*
	 * Whatever the situation with buffered rx packets, or explicitly read-
	 * and-buffered rx going to be handled before we want to acknowledge the
	 * socket is gone, any sign of HUP always immediately means no more tx
	 * is possible.
	 */

	if ((pollfd->revents & LWS_POLLHUP) == LWS_POLLHUP) {
		wsi->socket_is_permanently_unusable = 1;

		if (!(pollfd->revents & pollfd->events & LWS_POLLIN)) {

			/* ... there are no pending rx packets waiting... */

			if (!lws_buflist_total_len(&wsi->buflist)) {

				/*
				 * ... nothing stashed in the buflist either,
				 * so acknowledge the wsi is done
				 */

				lwsl_wsi_debug(wsi, "Session Socket %d dead",
						    pollfd->fd);

				goto close_and_handled;
			}

			/*
			 * ... in fact we have some unread rx buffered in the
			 * input buflist.  Hold off the closing a bit...
			 */

			lws_set_timeout(wsi, PENDING_TIMEOUT_CLOSE_ACK, 3);
		}
	}

#ifdef _WIN32
	if (pollfd->revents & LWS_POLLOUT)
		wsi->sock_send_blocking = FALSE;
#endif

#if defined(LWS_WITH_TLS)
	if (lwsi_state(wsi) == LRS_SHUTDOWN &&
	    lws_is_ssl(wsi) && wsi->tls.ssl) {
		switch (__lws_tls_shutdown(wsi)) {
		case LWS_SSL_CAPABLE_DONE:
		case LWS_SSL_CAPABLE_ERROR:
			goto close_and_handled;

		case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
		case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			goto handled;
		}
	}
#endif
	wsi->could_have_pending = 0; /* clear back-to-back write detection */
	pt->inside_lws_service = 1;

	/* okay, what we came here to do... */

	/* if we got here, we should have wire protocol ops set on the wsi */
	assert(wsi->role_ops);

	// lwsl_notice("%s: %s: wsistate 0x%x\n", __func__, wsi->role_ops->name,
	//	    wsi->wsistate);

	switch (lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_handle_POLLIN).
					       handle_POLLIN(pt, wsi, pollfd)) {
	case LWS_HPI_RET_WSI_ALREADY_DIED:
		pt->inside_lws_service = 0;
		return 1;
	case LWS_HPI_RET_HANDLED:
		break;
	case LWS_HPI_RET_PLEASE_CLOSE_ME:
		//lwsl_notice("%s: %s pollin says please close me\n", __func__,
		//		wsi->role_ops->name);
close_and_handled:
		lwsl_wsi_debug(wsi, "Close and handled");
		lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "close_and_handled");
#if defined(_DEBUG) && defined(LWS_WITH_LIBUV)
		/*
		 * confirm close has no problem being called again while
		 * it waits for libuv service to complete the first async
		 * close
		 */
		if (!strcmp(context->event_loop_ops->name, "libuv"))
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "close_and_handled uv repeat test");
#endif
		/*
		 * pollfd may point to something else after the close
		 * due to pollfd swapping scheme on delete on some platforms
		 * we can't clear revents now because it'd be the wrong guy's
		 * revents
		 */
		pt->inside_lws_service = 0;
		return 1;
	default:
		assert(0);
	}
#if defined(LWS_WITH_TLS)
handled:
#endif
	pollfd->revents = 0;
	pt->inside_lws_service = 0;

	return 0;
}